

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_avx2.c
# Opt level: O0

int64_t k_means_horizontal_sum_avx2(__m256i a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  int64_t res;
  __m128i sum_high;
  __m128i sum;
  __m128i high;
  __m128i low;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_50;
  
  auVar2._8_8_ = in_register_00001218;
  auVar2._0_8_ = in_YMM0_H;
  auVar1._8_8_ = uStack_118;
  auVar1._0_8_ = local_120;
  auVar1 = vpaddq_avx(auVar2,auVar1);
  auVar2 = vpunpckhqdq_avx(auVar1,auVar1);
  auVar1 = vpaddq_avx(auVar1,auVar2);
  local_50 = auVar1._0_8_;
  return local_50;
}

Assistant:

static int64_t k_means_horizontal_sum_avx2(__m256i a) {
  const __m128i low = _mm256_castsi256_si128(a);
  const __m128i high = _mm256_extracti128_si256(a, 1);
  const __m128i sum = _mm_add_epi64(low, high);
  const __m128i sum_high = _mm_unpackhi_epi64(sum, sum);
  int64_t res;
  _mm_storel_epi64((__m128i *)&res, _mm_add_epi64(sum, sum_high));
  return res;
}